

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.h
# Opt level: O2

Float pbrt::InnerProduct(SpectrumHandle *a,SpectrumHandle *b)

{
  undefined1 auVar1 [16];
  float lambda;
  Float FVar2;
  undefined1 auVar3 [64];
  float fVar4;
  undefined1 extraout_var [60];
  
  fVar4 = 0.0;
  for (lambda = 360.0; lambda <= 830.0; lambda = lambda + 1.0) {
    FVar2 = SpectrumHandle::operator()(a,lambda);
    auVar3._0_4_ = SpectrumHandle::operator()(b,lambda);
    auVar3._4_60_ = extraout_var;
    auVar1 = vfmadd231ss_fma(ZEXT416((uint)fVar4),auVar3._0_16_,ZEXT416((uint)FVar2));
    fVar4 = auVar1._0_4_;
  }
  return fVar4 / 106.856895;
}

Assistant:

inline Float InnerProduct(SpectrumHandle a, SpectrumHandle b) {
    Float result = 0;
    for (Float lambda = Lambda_min; lambda <= Lambda_max; ++lambda)
        result += a(lambda) * b(lambda);
    return result / CIE_Y_integral;
}